

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O0

void read_exp(ifstream *f,string *buf)

{
  uint uVar1;
  byte local_21;
  int local_20;
  char local_19;
  int stack;
  char c;
  string *buf_local;
  ifstream *f_local;
  
  std::istream::get((char *)f);
  while( true ) {
    local_21 = 0;
    if (local_19 != '(') {
      local_21 = std::ios::good();
    }
    if ((local_21 & 1) == 0) break;
    std::istream::get((char *)f);
  }
  std::__cxx11::string::push_back((char)buf);
  local_20 = 1;
  while (uVar1 = std::ios::good(), (uVar1 & 1) != 0 && local_20 != 0) {
    std::istream::get((char *)f);
    std::__cxx11::string::operator+=((string *)buf,local_19);
    if (local_19 == ')') {
      local_20 = local_20 + -1;
    }
    if (local_19 == '(') {
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void read_exp(std::ifstream &f, std::string &buf) {

  char c;

  f.get(c);
  while (c!='(' && f.good()) f.get(c);

  buf.push_back(c);
  int stack = 1;

  while (f.good() && stack) {

    f.get(c);
    buf += c;

    if (c==')') stack--;
    if (c=='(') stack++;

  }

}